

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::str_writer<wchar_t>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          align_spec *spec,str_writer<wchar_t> *f)

{
  size_t sVar1;
  wchar_t wVar2;
  undefined8 *puVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  wchar_t __tmp;
  wchar_t *__src;
  size_t size;
  void *__dest;
  ulong uVar12;
  basic_buffer<wchar_t> *c;
  ulong uVar13;
  int iVar19;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar26;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  uVar13 = (ulong)spec->width_;
  uVar9 = f->size_;
  puVar3 = *(undefined8 **)this;
  lVar10 = puVar3[2];
  uVar11 = uVar13 - uVar9;
  if (uVar13 < uVar9 || uVar11 == 0) {
    uVar9 = uVar9 + lVar10;
    if ((ulong)puVar3[3] < uVar9) {
      (**(code **)*puVar3)(puVar3,uVar9);
    }
    puVar3[2] = uVar9;
    sVar4 = f->size_;
    if (sVar4 != 0) {
      __dest = (void *)(lVar10 * 4 + puVar3[1]);
      __src = f->s;
LAB_001321db:
      memmove(__dest,__src,sVar4 << 2);
      return;
    }
  }
  else {
    uVar12 = lVar10 + uVar13;
    if ((ulong)puVar3[3] < uVar12) {
      (**(code **)*puVar3)(puVar3,uVar12);
    }
    puVar3[2] = uVar12;
    auVar7 = _DAT_0015b050;
    auVar6 = _DAT_0015b040;
    auVar5 = _DAT_0015b030;
    lVar8 = puVar3[1];
    __dest = (void *)(lVar8 + lVar10 * 4);
    wVar2 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar12 = uVar11 >> 1;
      if (1 < uVar11) {
        __dest = (void *)((long)__dest + uVar12 * 4);
        uVar11 = uVar12 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar24._8_4_ = (int)uVar11;
        auVar24._0_8_ = uVar11;
        auVar24._12_4_ = (int)(uVar11 >> 0x20);
        lVar8 = lVar8 + lVar10 * 4;
        lVar10 = 0;
        auVar24 = auVar24 ^ _DAT_0015b050;
        do {
          auVar21._8_4_ = (int)lVar10;
          auVar21._0_8_ = lVar10;
          auVar21._12_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar25 = (auVar21 | auVar6) ^ auVar7;
          iVar19 = auVar24._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar19 && auVar24._0_4_ < auVar25._0_4_ ||
                      iVar19 < auVar25._4_4_) & 1)) {
            *(wchar_t *)(lVar8 + lVar10 * 4) = wVar2;
          }
          if ((auVar25._12_4_ != auVar24._12_4_ || auVar25._8_4_ <= auVar24._8_4_) &&
              auVar25._12_4_ <= auVar24._12_4_) {
            *(wchar_t *)(lVar8 + 4 + lVar10 * 4) = wVar2;
          }
          auVar21 = (auVar21 | auVar5) ^ auVar7;
          iVar26 = auVar21._4_4_;
          if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar21._0_4_ <= auVar24._0_4_)) {
            *(wchar_t *)(lVar8 + 8 + lVar10 * 4) = wVar2;
            *(wchar_t *)(lVar8 + 0xc + lVar10 * 4) = wVar2;
          }
          lVar10 = lVar10 + 4;
        } while ((uVar11 - ((uint)(uVar12 + 0x3fffffffffffffff) & 3)) + 4 != lVar10);
      }
      sVar1 = f->size_ * 4;
      if (f->size_ != 0) {
        memmove(__dest,f->s,sVar1);
      }
      auVar7 = _DAT_0015b050;
      auVar6 = _DAT_0015b040;
      auVar5 = _DAT_0015b030;
      if (uVar13 != uVar9) {
        uVar11 = (uVar13 * 4 + (uVar9 + uVar12) * -4) - 4;
        auVar25._8_4_ = (int)uVar11;
        auVar25._0_8_ = uVar11;
        auVar25._12_4_ = (int)(uVar11 >> 0x20);
        auVar16._0_8_ = uVar11 >> 2;
        auVar16._8_8_ = auVar25._8_8_ >> 2;
        uVar9 = 0;
        auVar16 = auVar16 ^ _DAT_0015b050;
        do {
          auVar22._8_4_ = (int)uVar9;
          auVar22._0_8_ = uVar9;
          auVar22._12_4_ = (int)(uVar9 >> 0x20);
          auVar24 = (auVar22 | auVar6) ^ auVar7;
          iVar19 = auVar16._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar19 && auVar16._0_4_ < auVar24._0_4_ ||
                      iVar19 < auVar24._4_4_) & 1)) {
            *(wchar_t *)((long)__dest + uVar9 * 4 + sVar1) = wVar2;
          }
          if ((auVar24._12_4_ != auVar16._12_4_ || auVar24._8_4_ <= auVar16._8_4_) &&
              auVar24._12_4_ <= auVar16._12_4_) {
            *(wchar_t *)((long)__dest + uVar9 * 4 + sVar1 + 4) = wVar2;
          }
          auVar24 = (auVar22 | auVar5) ^ auVar7;
          iVar26 = auVar24._4_4_;
          if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar24._0_4_ <= auVar16._0_4_)) {
            *(wchar_t *)((long)__dest + uVar9 * 4 + sVar1 + 8) = wVar2;
            *(wchar_t *)((long)__dest + uVar9 * 4 + sVar1 + 0xc) = wVar2;
          }
          uVar9 = uVar9 + 4;
        } while (((uVar11 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar13 != uVar9) {
        __dest = (void *)((long)__dest + uVar11 * 4);
        uVar11 = (uVar13 * 4 + uVar9 * -4) - 4;
        auVar14._8_4_ = (int)uVar11;
        auVar14._0_8_ = uVar11;
        auVar14._12_4_ = (int)(uVar11 >> 0x20);
        auVar15._0_8_ = uVar11 >> 2;
        auVar15._8_8_ = auVar14._8_8_ >> 2;
        lVar8 = lVar8 + lVar10 * 4;
        uVar9 = 0;
        auVar15 = auVar15 ^ _DAT_0015b050;
        do {
          auVar20._8_4_ = (int)uVar9;
          auVar20._0_8_ = uVar9;
          auVar20._12_4_ = (int)(uVar9 >> 0x20);
          auVar24 = (auVar20 | auVar6) ^ auVar7;
          iVar19 = auVar15._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar19 && auVar15._0_4_ < auVar24._0_4_ ||
                      iVar19 < auVar24._4_4_) & 1)) {
            *(wchar_t *)(lVar8 + uVar9 * 4) = wVar2;
          }
          if ((auVar24._12_4_ != auVar15._12_4_ || auVar24._8_4_ <= auVar15._8_4_) &&
              auVar24._12_4_ <= auVar15._12_4_) {
            *(wchar_t *)(lVar8 + 4 + uVar9 * 4) = wVar2;
          }
          auVar24 = (auVar20 | auVar5) ^ auVar7;
          iVar26 = auVar24._4_4_;
          if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar24._0_4_ <= auVar15._0_4_)) {
            *(wchar_t *)(lVar8 + 8 + uVar9 * 4) = wVar2;
            *(wchar_t *)(lVar8 + 0xc + uVar9 * 4) = wVar2;
          }
          uVar9 = uVar9 + 4;
        } while (((uVar11 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
      }
      sVar4 = f->size_;
      if (sVar4 != 0) {
        __src = f->s;
        goto LAB_001321db;
      }
    }
    else {
      sVar1 = f->size_ * 4;
      if (f->size_ != 0) {
        memmove(__dest,f->s,sVar1);
      }
      auVar7 = _DAT_0015b050;
      auVar6 = _DAT_0015b040;
      auVar5 = _DAT_0015b030;
      if (uVar13 != uVar9) {
        uVar11 = (uVar13 * 4 + uVar9 * -4) - 4;
        auVar17._8_4_ = (int)uVar11;
        auVar17._0_8_ = uVar11;
        auVar17._12_4_ = (int)(uVar11 >> 0x20);
        auVar18._0_8_ = uVar11 >> 2;
        auVar18._8_8_ = auVar17._8_8_ >> 2;
        lVar8 = lVar10 * 4 + sVar1 + lVar8;
        uVar9 = 0;
        auVar18 = auVar18 ^ _DAT_0015b050;
        do {
          auVar23._8_4_ = (int)uVar9;
          auVar23._0_8_ = uVar9;
          auVar23._12_4_ = (int)(uVar9 >> 0x20);
          auVar24 = (auVar23 | auVar6) ^ auVar7;
          iVar19 = auVar18._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar19 && auVar18._0_4_ < auVar24._0_4_ ||
                      iVar19 < auVar24._4_4_) & 1)) {
            *(wchar_t *)(lVar8 + uVar9 * 4) = wVar2;
          }
          if ((auVar24._12_4_ != auVar18._12_4_ || auVar24._8_4_ <= auVar18._8_4_) &&
              auVar24._12_4_ <= auVar18._12_4_) {
            *(wchar_t *)(lVar8 + 4 + uVar9 * 4) = wVar2;
          }
          auVar24 = (auVar23 | auVar5) ^ auVar7;
          iVar26 = auVar24._4_4_;
          if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar24._0_4_ <= auVar18._0_4_)) {
            *(wchar_t *)(lVar8 + 8 + uVar9 * 4) = wVar2;
            *(wchar_t *)(lVar8 + 0xc + uVar9 * 4) = wVar2;
          }
          uVar9 = uVar9 + 4;
        } while (((uVar11 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
      }
    }
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }